

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O0

void eddsa_sign(ssh_key *key,ptrlen data,uint flags,BinarySink *bs)

{
  BinarySink *pBVar1;
  ecsign_extra *extra_00;
  uint8_t uVar2;
  eddsa_key *ek_00;
  ssh_hash *psVar3;
  mp_int *y;
  mp_int *pmVar4;
  mp_int *n;
  EdwardsPoint *point;
  strbuf *sb;
  mp_int *y_00;
  mp_int *x;
  ptrlen pVar5;
  ulong local_140;
  size_t i_1;
  mp_int *s;
  mp_int *Ha;
  mp_int *H;
  strbuf *r_enc;
  EdwardsPoint *r;
  mp_int *log_r;
  mp_int *log_r_unreduced;
  mp_int *a;
  size_t i;
  ssh_hash *h;
  uchar hash [114];
  ecsign_extra *extra;
  eddsa_key *ek;
  BinarySink *bs_local;
  uint flags_local;
  ssh_key *key_local;
  ptrlen data_local;
  
  ek_00 = (eddsa_key *)(key + -3);
  unique0x00012000 = (ecsign_extra *)key->vt->extra;
  if (key[-1].vt != (ssh_keyalg *)0x0) {
    psVar3 = ssh_hash_new(unique0x00012000->hash);
    for (a = (mp_int *)0x0; a < (mp_int *)ek_00->curve->fieldBytes; a = (mp_int *)((long)&a->nw + 1)
        ) {
      pBVar1 = psVar3->binarysink_;
      uVar2 = mp_get_byte((mp_int *)key[-1].vt,(size_t)a);
      BinarySink_put_byte(pBVar1,uVar2);
    }
    ssh_hash_final(psVar3,(uchar *)&h);
    pVar5 = make_ptrlen(&h,ek_00->curve->fieldBytes);
    y = eddsa_exponent_from_hash(pVar5,ek_00->curve);
    psVar3 = ssh_hash_new(stack0xffffffffffffffc0->hash);
    BinarySink_put_datapl(psVar3->binarysink_,stack0xffffffffffffffc0->hash_prefix);
    BinarySink_put_data(psVar3->binarysink_,hash + (ek_00->curve->fieldBytes - 8),
                        stack0xffffffffffffffc0->hash->hlen - ek_00->curve->fieldBytes);
    BinarySink_put_datapl(psVar3->binarysink_,data);
    ssh_hash_final(psVar3,(uchar *)&h);
    pVar5 = make_ptrlen(&h,stack0xffffffffffffffc0->hash->hlen);
    pmVar4 = mp_from_bytes_le(pVar5);
    n = mp_mod(pmVar4,(ek_00->curve->field_6).w.G_order);
    mp_free(pmVar4);
    point = ecc_edwards_multiply((ek_00->curve->field_6).e.G,n);
    sb = strbuf_new();
    BinarySink_put_epoint(sb->binarysink_,point,ek_00->curve,true);
    ecc_edwards_point_free(point);
    extra_00 = stack0xffffffffffffffc0;
    pVar5 = ptrlen_from_strbuf(sb);
    pmVar4 = eddsa_signing_exponent_from_data(ek_00,extra_00,pVar5,data);
    y_00 = mp_modmul(pmVar4,y,(ek_00->curve->field_6).w.G_order);
    x = mp_modadd(n,y_00,(ek_00->curve->field_6).w.G_order);
    mp_free(pmVar4);
    mp_free(y);
    mp_free(y_00);
    mp_free(n);
    BinarySink_put_stringz(bs->binarysink_,key->vt->ssh_id);
    BinarySink_put_uint32(bs->binarysink_,sb->len + ek_00->curve->fieldBytes);
    BinarySink_put_data(bs->binarysink_,sb->u,sb->len);
    strbuf_free(sb);
    for (local_140 = 0; local_140 < ek_00->curve->fieldBytes; local_140 = local_140 + 1) {
      pBVar1 = bs->binarysink_;
      uVar2 = mp_get_byte(x,local_140);
      BinarySink_put_byte(pBVar1,uVar2);
    }
    mp_free(x);
    return;
  }
  __assert_fail("ek->privateKey",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ecc-ssh.c"
                ,0x497,"void eddsa_sign(ssh_key *, ptrlen, unsigned int, BinarySink *)");
}

Assistant:

static void eddsa_sign(ssh_key *key, ptrlen data,
                       unsigned flags, BinarySink *bs)
{
    struct eddsa_key *ek = container_of(key, struct eddsa_key, sshk);
    const struct ecsign_extra *extra =
        (const struct ecsign_extra *)ek->sshk.vt->extra;
    assert(ek->privateKey);

    /*
     * EdDSA prescribes a specific method of generating the random
     * nonce integer for the signature. (A verifier can't tell
     * whether you followed that method, but it's important to
     * follow it anyway, because test vectors will want a specific
     * signature for a given message, and because this preserves
     * determinism of signatures even if the same signature were
     * made twice by different software.)
     */

    /*
     * First, we hash the private key integer (bare, little-endian)
     * into a hash generating 2*fieldBytes of output.
     */
    unsigned char hash[MAX_HASH_LEN];
    ssh_hash *h = ssh_hash_new(extra->hash);
    for (size_t i = 0; i < ek->curve->fieldBytes; ++i)
        put_byte(h, mp_get_byte(ek->privateKey, i));
    ssh_hash_final(h, hash);

    /*
     * The first half of the output hash is converted into an
     * integer a, by the standard EdDSA transformation.
     */
    mp_int *a = eddsa_exponent_from_hash(
        make_ptrlen(hash, ek->curve->fieldBytes), ek->curve);

    /*
     * The second half of the hash of the private key is hashed again
     * with the message to be signed, and used as an exponent to
     * generate the signature point r.
     */
    h = ssh_hash_new(extra->hash);
    put_datapl(h, extra->hash_prefix);
    put_data(h, hash + ek->curve->fieldBytes,
             extra->hash->hlen - ek->curve->fieldBytes);
    put_datapl(h, data);
    ssh_hash_final(h, hash);
    mp_int *log_r_unreduced = mp_from_bytes_le(
        make_ptrlen(hash, extra->hash->hlen));
    mp_int *log_r = mp_mod(log_r_unreduced, ek->curve->e.G_order);
    mp_free(log_r_unreduced);
    EdwardsPoint *r = ecc_edwards_multiply(ek->curve->e.G, log_r);

    /*
     * Encode r now, because we'll need its encoding for the next
     * hashing step as well as to write into the actual signature.
     */
    strbuf *r_enc = strbuf_new();
    put_epoint(r_enc, r, ek->curve, true); /* omit string header */
    ecc_edwards_point_free(r);

    /*
     * Compute the hash of (r || public key || message) just as
     * eddsa_verify does.
     */
    mp_int *H = eddsa_signing_exponent_from_data(
        ek, extra, ptrlen_from_strbuf(r_enc), data);

    /* And then s = (log(r) + H*a) mod order(G). */
    mp_int *Ha = mp_modmul(H, a, ek->curve->e.G_order);
    mp_int *s = mp_modadd(log_r, Ha, ek->curve->e.G_order);
    mp_free(H);
    mp_free(a);
    mp_free(Ha);
    mp_free(log_r);

    /* Format the output */
    put_stringz(bs, ek->sshk.vt->ssh_id);
    put_uint32(bs, r_enc->len + ek->curve->fieldBytes);
    put_data(bs, r_enc->u, r_enc->len);
    strbuf_free(r_enc);
    for (size_t i = 0; i < ek->curve->fieldBytes; ++i)
        put_byte(bs, mp_get_byte(s, i));
    mp_free(s);
}